

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::handshake(Client *this)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[5])();
  if ((char)iVar1 != '\0') {
    uVar2 = Chrono::steadyMSecs();
    this->m_expire = uVar2 + 20000;
    Tls::handshake(this->m_tls);
    return;
  }
  login(this);
  return;
}

Assistant:

void xmrig::Client::handshake()
{
#   ifdef XMRIG_FEATURE_TLS
    if (isTLS()) {
        m_expire = Chrono::steadyMSecs() + kResponseTimeout;

        m_tls->handshake();
    }
    else
#   endif
    {
        login();
    }
}